

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O2

bool __thiscall FilteredLT::ignore_edge(FilteredLT *this,int e)

{
  BoolView *pBVar1;
  bool bVar2;
  
  pBVar1 = (this->p->es).data;
  if ((sat.assigns.data[(uint)pBVar1[(uint)e].v] != '\0') &&
     (bVar2 = BoolView::isFalse(pBVar1 + (uint)e), bVar2)) {
    return true;
  }
  return false;
}

Assistant:

bool FilteredLT::ignore_edge(int e) {
	if (p->getEdgeVar(e).isFixed() && p->getEdgeVar(e).isFalse()) {
		return true;
	}
	return false;
}